

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStaticConstructor
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *code,IDLOptions *options)

{
  IdlNamer *this_00;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  string local_120;
  function<void_()> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string params;
  anon_class_24_3_05e67fb7 local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"",(allocator<char> *)&local_120);
  StructConstructorParams(&params,this,struct_def,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"create",&local_141);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_142);
  this_00 = &this->namer_;
  IdlNamer::LegacyJavaMethod2(&local_140,this_00,&local_120,struct_def,&local_80);
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_e0,this_00,struct_def);
  std::operator+(&local_c0,"Offset<",&local_e0);
  std::operator+(&local_a0,&local_c0,'>');
  local_40.this = this;
  local_40.struct_def = struct_def;
  local_40.code = code;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStaticConstructor(flatbuffers::StructDef_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_100,&local_40);
  GenerateFun(code,&local_140,&params,&local_a0,&local_100,options->gen_jvmstatic);
  std::_Function_base::~_Function_base(&local_100.super__Function_base);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&params);
  return;
}

Assistant:

void GenerateStaticConstructor(const StructDef &struct_def, CodeWriter &code,
                                 const IDLOptions options) const {
    // create a struct constructor function
    auto params = StructConstructorParams(struct_def);
    GenerateFun(
        code, namer_.LegacyJavaMethod2("create", struct_def, ""), params,
        "Offset<" + namer_.Type(struct_def) + '>',
        [&]() {
          GenStructBody(struct_def, code, "");
          code += "return Offset(builder.offset())";
        },
        options.gen_jvmstatic);
  }